

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::reallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,int line,bool allocatNodesSeperately)

{
  char *pcVar1;
  char *in_RCX;
  TestMemoryAllocator *in_RDX;
  MemoryLeakDetector *in_RSI;
  undefined8 in_RDI;
  int line_00;
  MemoryLeakDetector *in_R8;
  undefined4 in_R9D;
  undefined1 in_stack_00000008;
  MemoryLeakDetectorNode *node;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  TestMemoryAllocator *in_stack_ffffffffffffffb0;
  MemoryLeakDetectorNode *in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc8;
  uint uVar2;
  
  line_00 = (int)((ulong)in_RDI >> 0x20);
  uVar2 = CONCAT13(in_stack_00000008,in_stack_ffffffffffffffc8) & 0x1ffffff;
  if (in_RDX != (TestMemoryAllocator *)0x0) {
    in_stack_ffffffffffffffc0 =
         MemoryLeakDetectorTable::removeNode
                   ((MemoryLeakDetectorTable *)in_stack_ffffffffffffffb0,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_stack_ffffffffffffffc0 == (MemoryLeakDetectorNode *)0x0) {
      MemoryLeakOutputStringBuffer::reportDeallocateNonAllocatedMemoryFailure
                ((MemoryLeakOutputStringBuffer *)in_RSI,(char *)in_RDX,(int)((ulong)in_RCX >> 0x20),
                 (TestMemoryAllocator *)in_R8,(MemoryLeakFailure *)CONCAT44(in_R9D,uVar2));
      return (char *)0x0;
    }
    checkForCorruption(in_R8,(MemoryLeakDetectorNode *)CONCAT44(in_R9D,uVar2),
                       (char *)in_stack_ffffffffffffffc0,line_00,in_stack_ffffffffffffffb0,
                       SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
  }
  pcVar1 = reallocateMemoryAndLeakInformation
                     (in_RSI,in_RDX,in_RCX,(size_t)in_R8,(char *)CONCAT44(in_R9D,uVar2),
                      (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  return pcVar1;
}

Assistant:

char* MemoryLeakDetector::reallocMemory(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, int line, bool allocatNodesSeperately)
{
    if (memory) {
        MemoryLeakDetectorNode* node = memoryTable_.removeNode(memory);
        if (node == NULL) {
            outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
            return NULL;
        }
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
    }
    return reallocateMemoryAndLeakInformation(allocator, memory, size, file, line, allocatNodesSeperately);
}